

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

uint64_t __thiscall binlog::Session::addEventSource(Session *this,EventSource *eventSource)

{
  EventSource *in_RSI;
  RecoverableVectorOutputStream *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  uint64_t uVar1;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RSI->id = *(uint64_t *)
                &in_RDI[5]._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl;
  serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
            (in_RSI,in_RDI);
  uVar1 = *(uint64_t *)&in_RDI[5]._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl;
  *(uint64_t *)&in_RDI[5]._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl =
       uVar1 + 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x103403);
  return uVar1;
}

Assistant:

inline std::uint64_t Session::addEventSource(EventSource eventSource)
{
  std::lock_guard<std::mutex> lock(_mutex);

  eventSource.id = _nextSourceId;
  serializeSizePrefixedTagged(eventSource, _sources);
  return _nextSourceId++;
}